

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QString * __thiscall
QtPrivate::QCalendarModel::dayName
          (QString *__return_storage_ptr__,QCalendarModel *this,DayOfWeek day)

{
  HorizontalHeaderFormat HVar1;
  QLocale QVar2;
  QChar *pQVar3;
  undefined1 *puVar4;
  char cVar5;
  FormatType FVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QLocale QStack_68;
  QLocale local_60;
  storage_type_conflict *local_58;
  undefined1 *local_50;
  QLocale local_48;
  QChar *pQStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  HVar1 = this->m_horizontalHeaderFormat;
  if (HVar1 == LongDayNames) {
    QWidget::locale(&local_48,(QWidget *)this->m_view);
    FVar6 = (FormatType)&local_48;
LAB_003c8080:
    QLocale::dayName((int)__return_storage_ptr__,FVar6);
    QLocale::~QLocale(&local_48);
  }
  else {
    if (HVar1 == ShortDayNames) {
      QWidget::locale(&local_48,(QWidget *)this->m_view);
      FVar6 = (FormatType)&local_48;
      goto LAB_003c8080;
    }
    if (HVar1 != SingleLetterDayNames) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_003c8196;
    }
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale(&local_60,(QWidget *)this->m_view);
    QLocale::standaloneDayName((int)&local_48,(FormatType)&local_60);
    QLocale::~QLocale(&local_60);
    QWidget::locale(&QStack_68,(QWidget *)this->m_view);
    QLocale::dayName((int)&local_60,(FormatType)&QStack_68);
    if (local_38 == local_50) {
      QVar7.m_data = local_58;
      QVar7.m_size = (qsizetype)local_38;
      QVar8.m_data = &pQStack_40->ucs;
      QVar8.m_size = (qsizetype)local_38;
      cVar5 = QtPrivate::equalStrings(QVar8,QVar7);
    }
    else {
      cVar5 = '\0';
    }
    if (local_60 != (QLocale)0x0) {
      LOCK();
      *(int *)local_60 = *(int *)local_60 + -1;
      UNLOCK();
      if (*(int *)local_60 == 0) {
        QArrayData::deallocate((QArrayData *)local_60,2,0x10);
      }
    }
    QLocale::~QLocale(&QStack_68);
    puVar4 = local_38;
    pQVar3 = pQStack_40;
    QVar2 = local_48;
    if (cVar5 == '\0') {
      local_48 = (QLocale)0x0;
      pQStack_40 = (QChar *)0x0;
      (__return_storage_ptr__->d).d = (Data *)QVar2;
      (__return_storage_ptr__->d).ptr = &pQVar3->ucs;
      local_38 = (undefined1 *)0x0;
      (__return_storage_ptr__->d).size = (qsizetype)puVar4;
    }
    else if (local_38 < (undefined1 *)0x2) {
      (__return_storage_ptr__->d).d = (Data *)local_48;
      (__return_storage_ptr__->d).ptr = &pQStack_40->ucs;
      (__return_storage_ptr__->d).size = (qsizetype)local_38;
      if (local_48 != (QLocale)0x0) {
        LOCK();
        *(int *)local_48 = *(int *)local_48 + 1;
        UNLOCK();
      }
    }
    else {
      QString::QString(__return_storage_ptr__,pQStack_40,1);
    }
    if (local_48 != (QLocale)0x0) {
      LOCK();
      *(int *)local_48 = *(int *)local_48 + -1;
      UNLOCK();
      if (*(int *)local_48 == 0) {
        QArrayData::deallocate((QArrayData *)local_48,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003c8196:
  __stack_chk_fail();
}

Assistant:

QString QCalendarModel::dayName(Qt::DayOfWeek day) const
{
    switch (m_horizontalHeaderFormat) {
        case QCalendarWidget::SingleLetterDayNames: {
            QString standaloneDayName = m_view->locale().standaloneDayName(day, QLocale::NarrowFormat);
            if (standaloneDayName == m_view->locale().dayName(day, QLocale::NarrowFormat))
                return standaloneDayName.left(1);
            return standaloneDayName;
        }
        case QCalendarWidget::ShortDayNames:
            return m_view->locale().dayName(day, QLocale::ShortFormat);
        case QCalendarWidget::LongDayNames:
            return m_view->locale().dayName(day, QLocale::LongFormat);
        default:
            break;
    }
    return QString();
}